

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_delay_init(ma_delay_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks,
                       ma_delay *pDelay)

{
  void *pvVar1;
  undefined8 *in_RDX;
  undefined8 *in_RDI;
  size_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  ma_result mVar2;
  void *p;
  
  if (in_RDX == (undefined8 *)0x0) {
    mVar2 = MA_INVALID_ARGS;
  }
  else {
    p = (void *)0x30;
    if (in_RDX != (undefined8 *)0x0) {
      memset(in_RDX,0,0x30);
    }
    if (in_RDI == (undefined8 *)0x0) {
      mVar2 = MA_INVALID_ARGS;
    }
    else if ((*(float *)(in_RDI + 3) <= 0.0 && *(float *)(in_RDI + 3) != 0.0) ||
            (1.0 < *(float *)(in_RDI + 3))) {
      mVar2 = MA_INVALID_ARGS;
    }
    else {
      *in_RDX = *in_RDI;
      in_RDX[1] = in_RDI[1];
      in_RDX[2] = in_RDI[2];
      *(undefined4 *)(in_RDX + 3) = *(undefined4 *)(in_RDI + 3);
      *(undefined4 *)(in_RDX + 4) = *(undefined4 *)(in_RDI + 1);
      *(undefined4 *)((long)in_RDX + 0x1c) = 0;
      ma_get_bytes_per_sample(ma_format_f32);
      pvVar1 = ma_malloc(in_stack_ffffffffffffffb8,(ma_allocation_callbacks *)0x21d4cb);
      in_RDX[5] = pvVar1;
      if (in_RDX[5] == 0) {
        mVar2 = MA_OUT_OF_MEMORY;
      }
      else {
        ma_silence_pcm_frames
                  (p,CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   (ma_format)((ulong)in_RDI >> 0x20),(ma_uint32)in_RDI);
        mVar2 = MA_SUCCESS;
      }
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_delay_init(const ma_delay_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_delay* pDelay)
{
    if (pDelay == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pDelay);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->decay < 0 || pConfig->decay > 1) {
        return MA_INVALID_ARGS;
    }

    pDelay->config             = *pConfig;
    pDelay->bufferSizeInFrames = pConfig->delayInFrames;
    pDelay->cursor             = 0;

    pDelay->pBuffer = (float*)ma_malloc((size_t)(pDelay->bufferSizeInFrames * ma_get_bytes_per_frame(ma_format_f32, pConfig->channels)), pAllocationCallbacks);
    if (pDelay->pBuffer == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    ma_silence_pcm_frames(pDelay->pBuffer, pDelay->bufferSizeInFrames, ma_format_f32, pConfig->channels);

    return MA_SUCCESS;
}